

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O1

void __thiscall OpenMD::SimInfo::removeInteractionPairs(SimInfo *this,Molecule *mol)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ForceField *pFVar5;
  pointer ppAVar6;
  Bond *pBVar7;
  Bend *pBVar8;
  Torsion *pTVar9;
  Inversion *pIVar10;
  long lVar11;
  pointer ppSVar12;
  StuntDouble *pSVar13;
  long lVar14;
  pointer ppBVar15;
  PairList *pPVar16;
  PairList *pPVar17;
  pointer ppRVar18;
  long lVar19;
  PairList *pPVar20;
  RigidBody *pRVar21;
  PairList *pPVar22;
  void *pvVar23;
  pointer ppIVar24;
  long lVar25;
  pointer ppBVar26;
  pointer ppTVar27;
  long lVar28;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> atoms_1;
  set<int,_std::less<int>,_std::allocator<int>_> rigidAtoms;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  atomGroups;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> local_e8;
  undefined1 local_d0 [8];
  undefined1 local_c8 [48];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_98;
  PairList *local_68;
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_60;
  
  pFVar5 = this->forceField_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pSVar13 = (StuntDouble *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppSVar12 = (mol->integrableObjects_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar12 !=
      (mol->integrableObjects_).
      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar13 = *ppSVar12;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pSVar13 != (StuntDouble *)0x0) {
    do {
      if (pSVar13->objType_ == otRigidBody) {
        std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
                  (&local_e8,
                   (vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)&pSVar13[2].mass_);
        local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_98._M_impl.super__Rb_tree_header._M_header;
        local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_right =
             local_98._M_impl.super__Rb_tree_header._M_header._M_left;
        if (0 < (int)((ulong)((long)local_e8.
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_e8.
                                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
          lVar14 = 0;
          do {
            local_d0._0_4_ =
                 (local_e8.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar14]->super_StuntDouble).globalIndex_;
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _M_insert_unique<int>(&local_98,(int *)local_d0);
            lVar14 = lVar14 + 1;
          } while (lVar14 < (int)((ulong)((long)local_e8.
                                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_e8.
                                               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        if (0 < (int)((ulong)((long)local_e8.
                                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_e8.
                                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
          lVar14 = 0;
          do {
            local_d0._0_4_ =
                 (local_e8.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar14]->super_StuntDouble).globalIndex_;
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            _Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)local_c8,&local_98);
            std::
            _Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
            ::
            _M_insert_unique<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>
                      ((_Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                        *)&local_60,
                       (pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
                       local_d0);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)local_c8);
            lVar14 = lVar14 + 1;
          } while (lVar14 < (int)((ulong)((long)local_e8.
                                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_e8.
                                               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_98);
        if (local_e8.super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.
                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_e8.
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_98._M_impl.super__Rb_tree_header._M_header;
        local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_d0._0_4_ = pSVar13->globalIndex_;
        local_98._M_impl.super__Rb_tree_header._M_header._M_right =
             local_98._M_impl.super__Rb_tree_header._M_header._M_left;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&local_98,(int *)local_d0);
        local_d0._0_4_ = pSVar13->globalIndex_;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   local_c8,&local_98);
        std::
        _Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
        ::_M_insert_unique<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>
                  ((_Rb_tree<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>>
                    *)&local_60,
                   (pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)local_d0
                  );
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_c8);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_98);
      }
      ppSVar12 = ppSVar12 + 1;
      if (ppSVar12 ==
          (mol->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar13 = (StuntDouble *)0x0;
      }
      else {
        pSVar13 = *ppSVar12;
      }
    } while (pSVar13 != (StuntDouble *)0x0);
  }
  ppBVar15 = (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar15 ==
      (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar7 = (Bond *)0x0;
  }
  else {
    pBVar7 = *ppBVar15;
  }
  if (pBVar7 != (Bond *)0x0) {
    do {
      ppBVar15 = ppBVar15 + 1;
      pPVar22 = &this->oneTwoInteractions_;
      if (((pFVar5->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
         ((pFVar5->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
        pPVar22 = &this->excludedInteractions_;
      }
      ppAVar6 = (pBVar7->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      PairList::removePair
                (pPVar22,((*ppAVar6)->super_StuntDouble).globalIndex_,
                 (ppAVar6[1]->super_StuntDouble).globalIndex_);
      if (ppBVar15 ==
          (mol->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pBVar7 = (Bond *)0x0;
      }
      else {
        pBVar7 = *ppBVar15;
      }
    } while (pBVar7 != (Bond *)0x0);
  }
  ppBVar26 = (mol->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar26 ==
      (mol->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar8 = (Bend *)0x0;
  }
  else {
    pBVar8 = *ppBVar26;
  }
  if (pBVar8 != (Bend *)0x0) {
    pPVar22 = &this->excludedInteractions_;
    do {
      ppBVar26 = ppBVar26 + 1;
      ppAVar6 = (pBVar8->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar1 = ((*ppAVar6)->super_StuntDouble).globalIndex_;
      iVar2 = (ppAVar6[1]->super_StuntDouble).globalIndex_;
      iVar3 = (ppAVar6[2]->super_StuntDouble).globalIndex_;
      if (((pFVar5->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
         ((pFVar5->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
        PairList::removePair(pPVar22,iVar1,iVar2);
        pPVar16 = pPVar22;
      }
      else {
        PairList::removePair(&this->oneTwoInteractions_,iVar1,iVar2);
        pPVar16 = &this->oneTwoInteractions_;
      }
      PairList::removePair(pPVar16,iVar2,iVar3);
      pPVar16 = &this->oneThreeInteractions_;
      if (((pFVar5->forceFieldOptions_).vdw13scale.super_ParameterBase.empty_ == true) &&
         ((pFVar5->forceFieldOptions_).electrostatic13scale.super_ParameterBase.empty_ != false)) {
        pPVar16 = pPVar22;
      }
      PairList::removePair(pPVar16,iVar1,iVar3);
      if (ppBVar26 ==
          (mol->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pBVar8 = (Bend *)0x0;
      }
      else {
        pBVar8 = *ppBVar26;
      }
    } while (pBVar8 != (Bend *)0x0);
  }
  ppTVar27 = (mol->torsions_).
             super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppTVar27 ==
      (mol->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar9 = (Torsion *)0x0;
  }
  else {
    pTVar9 = *ppTVar27;
  }
  if (pTVar9 != (Torsion *)0x0) {
    pPVar22 = &this->oneTwoInteractions_;
    pPVar16 = &this->excludedInteractions_;
    local_68 = &this->oneThreeInteractions_;
    do {
      ppTVar27 = ppTVar27 + 1;
      ppAVar6 = (pTVar9->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar1 = ((*ppAVar6)->super_StuntDouble).globalIndex_;
      iVar2 = (ppAVar6[1]->super_StuntDouble).globalIndex_;
      iVar3 = (ppAVar6[2]->super_StuntDouble).globalIndex_;
      iVar4 = (ppAVar6[3]->super_StuntDouble).globalIndex_;
      if (((pFVar5->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
         ((pFVar5->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
        PairList::removePair(pPVar16,iVar1,iVar2);
        PairList::removePair(pPVar16,iVar2,iVar3);
        pPVar20 = pPVar16;
      }
      else {
        PairList::removePair(pPVar22,iVar1,iVar2);
        PairList::removePair(pPVar22,iVar2,iVar3);
        pPVar20 = pPVar22;
      }
      PairList::removePair(pPVar20,iVar3,iVar4);
      pPVar20 = local_68;
      if (((pFVar5->forceFieldOptions_).vdw13scale.super_ParameterBase.empty_ == true) &&
         ((pFVar5->forceFieldOptions_).electrostatic13scale.super_ParameterBase.empty_ != false)) {
        PairList::removePair(pPVar16,iVar1,iVar3);
        pPVar20 = pPVar16;
      }
      else {
        PairList::removePair(local_68,iVar1,iVar3);
      }
      PairList::removePair(pPVar20,iVar2,iVar4);
      pPVar20 = &this->oneFourInteractions_;
      if (((pFVar5->forceFieldOptions_).vdw14scale.super_ParameterBase.empty_ == true) &&
         ((pFVar5->forceFieldOptions_).electrostatic14scale.super_ParameterBase.empty_ != false)) {
        pPVar20 = pPVar16;
      }
      PairList::removePair(pPVar20,iVar1,iVar4);
      if (ppTVar27 ==
          (mol->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pTVar9 = (Torsion *)0x0;
      }
      else {
        pTVar9 = *ppTVar27;
      }
    } while (pTVar9 != (Torsion *)0x0);
  }
  ppIVar24 = (mol->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppIVar24 ==
      (mol->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pIVar10 = (Inversion *)0x0;
  }
  else {
    pIVar10 = *ppIVar24;
  }
  if (pIVar10 != (Inversion *)0x0) {
    pPVar22 = &this->oneTwoInteractions_;
    pPVar16 = &this->excludedInteractions_;
    pPVar20 = &this->oneThreeInteractions_;
    do {
      ppIVar24 = ppIVar24 + 1;
      ppAVar6 = (pIVar10->super_ShortRangeInteraction).atoms_.
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar1 = ((*ppAVar6)->super_StuntDouble).globalIndex_;
      iVar2 = (ppAVar6[1]->super_StuntDouble).globalIndex_;
      iVar3 = (ppAVar6[2]->super_StuntDouble).globalIndex_;
      iVar4 = (ppAVar6[3]->super_StuntDouble).globalIndex_;
      if (((pFVar5->forceFieldOptions_).vdw12scale.super_ParameterBase.empty_ == true) &&
         ((pFVar5->forceFieldOptions_).electrostatic12scale.super_ParameterBase.empty_ != false)) {
        PairList::removePair(pPVar16,iVar1,iVar2);
        PairList::removePair(pPVar16,iVar1,iVar3);
        pPVar17 = pPVar16;
      }
      else {
        PairList::removePair(pPVar22,iVar1,iVar2);
        PairList::removePair(pPVar22,iVar1,iVar3);
        pPVar17 = pPVar22;
      }
      PairList::removePair(pPVar17,iVar1,iVar4);
      if (((pFVar5->forceFieldOptions_).vdw13scale.super_ParameterBase.empty_ == true) &&
         ((pFVar5->forceFieldOptions_).electrostatic13scale.super_ParameterBase.empty_ != false)) {
        PairList::removePair(pPVar16,iVar2,iVar3);
        PairList::removePair(pPVar16,iVar2,iVar4);
        pPVar17 = pPVar16;
      }
      else {
        PairList::removePair(pPVar20,iVar2,iVar3);
        PairList::removePair(pPVar20,iVar2,iVar4);
        pPVar17 = pPVar20;
      }
      PairList::removePair(pPVar17,iVar3,iVar4);
      if (ppIVar24 ==
          (mol->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar10 = (Inversion *)0x0;
      }
      else {
        pIVar10 = *ppIVar24;
      }
    } while (pIVar10 != (Inversion *)0x0);
  }
  ppRVar18 = (mol->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppRVar18 ==
      (mol->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pRVar21 = (RigidBody *)0x0;
  }
  else {
    pRVar21 = *ppRVar18;
  }
  if (pRVar21 != (RigidBody *)0x0) {
    do {
      std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::vector
                ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)local_d0,
                 &pRVar21->atoms_);
      pvVar23 = (void *)CONCAT44(local_d0._4_4_,local_d0._0_4_);
      if (1 < (int)((ulong)(local_c8._0_8_ - (long)pvVar23) >> 3)) {
        lVar19 = 1;
        lVar14 = 0;
        do {
          lVar28 = lVar14 + 1;
          lVar11 = CONCAT44(local_d0._4_4_,local_d0._0_4_);
          lVar25 = lVar19;
          if (lVar28 < (int)((ulong)(local_c8._0_8_ - lVar11) >> 3)) {
            do {
              PairList::removePair
                        (&this->excludedInteractions_,
                         *(int *)(*(long *)(lVar11 + lVar14 * 8) + 0x28),
                         *(int *)(*(long *)(lVar11 + lVar25 * 8) + 0x28));
              lVar25 = lVar25 + 1;
              lVar11 = CONCAT44(local_d0._4_4_,local_d0._0_4_);
            } while (lVar25 < (int)((ulong)(local_c8._0_8_ - lVar11) >> 3));
          }
          pvVar23 = (void *)CONCAT44(local_d0._4_4_,local_d0._0_4_);
          lVar19 = lVar19 + 1;
          lVar14 = lVar28;
        } while (lVar28 < (local_c8._0_8_ - (long)pvVar23) * 0x20000000 + -0x100000000 >> 0x20);
      }
      if (pvVar23 != (void *)0x0) {
        operator_delete(pvVar23,local_c8._8_8_ - (long)pvVar23);
      }
      ppRVar18 = ppRVar18 + 1;
      if (ppRVar18 ==
          (mol->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pRVar21 = (RigidBody *)0x0;
      }
      else {
        pRVar21 = *ppRVar18;
      }
    } while (pRVar21 != (RigidBody *)0x0);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void SimInfo::removeInteractionPairs(Molecule* mol) {
    ForceFieldOptions& options_ = forceField_->getForceFieldOptions();
    vector<Bond*>::iterator bondIter;
    vector<Bend*>::iterator bendIter;
    vector<Torsion*>::iterator torsionIter;
    vector<Inversion*>::iterator inversionIter;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    int a;
    int b;
    int c;
    int d;

    map<int, set<int>> atomGroups;
    Molecule::RigidBodyIterator rbIter;
    RigidBody* rb;
    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;

    for (sd = mol->beginIntegrableObject(ii); sd != NULL;
         sd = mol->nextIntegrableObject(ii)) {
      if (sd->isRigidBody()) {
        rb                  = static_cast<RigidBody*>(sd);
        vector<Atom*> atoms = rb->getAtoms();
        set<int> rigidAtoms;
        for (int i = 0; i < static_cast<int>(atoms.size()); ++i) {
          rigidAtoms.insert(atoms[i]->getGlobalIndex());
        }
        for (int i = 0; i < static_cast<int>(atoms.size()); ++i) {
          atomGroups.insert(map<int, set<int>>::value_type(
              atoms[i]->getGlobalIndex(), rigidAtoms));
        }
      } else {
        set<int> oneAtomSet;
        oneAtomSet.insert(sd->getGlobalIndex());
        atomGroups.insert(
            map<int, set<int>>::value_type(sd->getGlobalIndex(), oneAtomSet));
      }
    }

    for (bond = mol->beginBond(bondIter); bond != NULL;
         bond = mol->nextBond(bondIter)) {
      a = bond->getAtomA()->getGlobalIndex();
      b = bond->getAtomB()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
      } else {
        excludedInteractions_.removePair(a, b);
      }
    }

    for (bend = mol->beginBend(bendIter); bend != NULL;
         bend = mol->nextBend(bendIter)) {
      a = bend->getAtomA()->getGlobalIndex();
      b = bend->getAtomB()->getGlobalIndex();
      c = bend->getAtomC()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(b, c);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(b, c);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(a, c);
      } else {
        excludedInteractions_.removePair(a, c);
      }
    }

    for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
         torsion = mol->nextTorsion(torsionIter)) {
      a = torsion->getAtomA()->getGlobalIndex();
      b = torsion->getAtomB()->getGlobalIndex();
      c = torsion->getAtomC()->getGlobalIndex();
      d = torsion->getAtomD()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(b, c);
        oneTwoInteractions_.removePair(c, d);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(b, c);
        excludedInteractions_.removePair(c, d);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(a, c);
        oneThreeInteractions_.removePair(b, d);
      } else {
        excludedInteractions_.removePair(a, c);
        excludedInteractions_.removePair(b, d);
      }

      if (options_.havevdw14scale() || options_.haveelectrostatic14scale()) {
        oneFourInteractions_.removePair(a, d);
      } else {
        excludedInteractions_.removePair(a, d);
      }
    }

    for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
         inversion = mol->nextInversion(inversionIter)) {
      a = inversion->getAtomA()->getGlobalIndex();
      b = inversion->getAtomB()->getGlobalIndex();
      c = inversion->getAtomC()->getGlobalIndex();
      d = inversion->getAtomD()->getGlobalIndex();

      if (options_.havevdw12scale() || options_.haveelectrostatic12scale()) {
        oneTwoInteractions_.removePair(a, b);
        oneTwoInteractions_.removePair(a, c);
        oneTwoInteractions_.removePair(a, d);
      } else {
        excludedInteractions_.removePair(a, b);
        excludedInteractions_.removePair(a, c);
        excludedInteractions_.removePair(a, d);
      }

      if (options_.havevdw13scale() || options_.haveelectrostatic13scale()) {
        oneThreeInteractions_.removePair(b, c);
        oneThreeInteractions_.removePair(b, d);
        oneThreeInteractions_.removePair(c, d);
      } else {
        excludedInteractions_.removePair(b, c);
        excludedInteractions_.removePair(b, d);
        excludedInteractions_.removePair(c, d);
      }
    }

    for (rb = mol->beginRigidBody(rbIter); rb != NULL;
         rb = mol->nextRigidBody(rbIter)) {
      vector<Atom*> atoms = rb->getAtoms();
      for (int i = 0; i < static_cast<int>(atoms.size()) - 1; ++i) {
        for (int j = i + 1; j < static_cast<int>(atoms.size()); ++j) {
          a = atoms[i]->getGlobalIndex();
          b = atoms[j]->getGlobalIndex();
          excludedInteractions_.removePair(a, b);
        }
      }
    }
  }